

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::Texture2DArrayView::sampleOffset
          (Texture2DArrayView *this,Sampler *sampler,float s,float t,float r,float lod,IVec2 *offset
          )

{
  WrapMode WVar1;
  undefined4 numLevels;
  int x_;
  int y_;
  int z_;
  Vector<int,_2> *in_RCX;
  Vec4 VVar2;
  Vector<int,_3> local_44;
  Vector<int,_2> *local_38;
  IVec2 *offset_local;
  float lod_local;
  float r_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  Texture2DArrayView *this_local;
  
  numLevels = sampler->wrapR;
  WVar1 = sampler->wrapS;
  local_38 = in_RCX;
  offset_local._0_4_ = lod;
  offset_local._4_4_ = r;
  lod_local = t;
  r_local = s;
  _t_local = offset;
  sampler_local = sampler;
  this_local = this;
  x_ = Vector<int,_2>::x(in_RCX);
  y_ = Vector<int,_2>::y(local_38);
  z_ = selectLayer((Texture2DArrayView *)sampler,offset_local._4_4_);
  Vector<int,_3>::Vector(&local_44,x_,y_,z_);
  VVar2 = sampleLevelArray2DOffset
                    ((ConstPixelBufferAccess *)this,numLevels,(Sampler *)(ulong)WVar1,s,t,lod,
                     (IVec3 *)offset);
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 Texture2DArrayView::sampleOffset (const Sampler& sampler, float s, float t, float r, float lod, const IVec2& offset) const
{
	return sampleLevelArray2DOffset(m_levels, m_numLevels, sampler, s, t, lod, IVec3(offset.x(), offset.y(), selectLayer(r)));
}